

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_append_failure_bufferExpansionFailed_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined8 uStack_60;
  char c;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = (char *)0x5;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = (char *)0x5;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_60 = 0x114493;
  local_20 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,6);
  builtin_strncpy(local_20,"01234",6);
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  c = '\0';
  uStack_60 = 0x1144d7;
  bVar1 = private_ACUtils_ADynArray_insertArray(&local_48,0xffffffffffffffff,&c,1,1);
  if (bVar1 != false) {
    local_78 = (char *)(ulong)bVar1;
    ppcVar6 = &local_78;
    local_70 = "false";
    pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar7 = 
    "private_ACUtils_ADynArray_insertArray(&array, -1, &(c), 1, sizeof(*(&array)->buffer)) == false"
    ;
    pcVar8 = "private_ACUtils_ADynArray_insertArray(&array, -1, &(c), 1, sizeof(*(&array)->buffer))"
    ;
    iVar2 = 0x513;
    goto LAB_00114740;
  }
  uStack_60 = 0x1144f0;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x513);
  if (local_30 == (char *)0x5) {
    uStack_60 = 0x114510;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x514);
    if (local_28 == (char *)0x5) {
      uStack_60 = 0x114530;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x515);
      if (local_20 == (char *)0x0) {
        ppcVar6 = &local_68;
        pcVar4 = "Assertion \'_ck_x != NULL\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) array.buffer != NULL";
        pcVar8 = "(void*) array.buffer";
        iVar2 = 0x516;
LAB_00114740:
        uStack_60 = 0;
        local_68 = (char *)0x0;
        *(code **)((long)ppcVar6 + -8) = test_ADynArray_append_failure_nullptr_fn;
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,iVar2,pcVar4,pcVar3,pcVar7,pcVar8);
      }
      uStack_60 = 0x11454d;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x516);
      pcStack_90 = local_20;
      if (local_20 == (char *)0x0) {
        pcVar3 = "";
        pcStack_90 = "(null)";
      }
      else {
        uStack_60 = 0x11456a;
        iVar2 = strcmp("01234",local_20);
        if (iVar2 == 0) {
          uStack_60 = 0x114583;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x517);
          if (local_38 != (code *)0x0) {
            uStack_60 = 0x1145a0;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x518);
            uStack_60 = 0x1145a9;
            (*pcStack_40)(local_20);
            return;
          }
          ppcVar6 = &local_68;
          pcVar4 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar7 = "(void*) array.growStrategy != NULL";
          pcVar8 = "(void*) array.growStrategy";
          iVar2 = 0x518;
          goto LAB_00114740;
        }
        pcVar3 = "\"";
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "array.buffer == \"01234\"";
      pcVar7 = "array.buffer";
      iVar2 = 0x517;
      local_68 = "\"";
      local_70 = "01234";
      local_78 = "\"";
      pcStack_80 = "\"01234\"";
      ppcVar5 = &pcStack_90;
      pcStack_88 = pcVar3;
      goto LAB_00114706;
    }
    pcVar4 = "array.capacity == 5";
    pcVar7 = "array.capacity";
    iVar2 = 0x515;
    pcVar3 = local_28;
  }
  else {
    pcVar4 = "array.size == 5";
    pcVar7 = "array.size";
    iVar2 = 0x514;
    pcVar3 = local_30;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  local_68 = (char *)0x5;
  ppcVar5 = &local_70;
  local_70 = "5";
LAB_00114706:
  uStack_60 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar3;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x11470d;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar8,pcVar4,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_append_failure_bufferExpansionFailed)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 5;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity + 1);
    memcpy(array.buffer, "01234", 6);
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    char c = '\0';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_append(&array, c), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 5);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 5);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01234");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.deallocator(array.buffer);
}